

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.h
# Opt level: O0

PrimaryHeader * lrit::getHeader<lrit::PrimaryHeader>(Buffer *b,HeaderMap *m)

{
  bool bVar1;
  runtime_error *this;
  PrimaryHeader *in_RDI;
  const_iterator it;
  int *in_stack_00000120;
  char (*in_stack_00000128) [2];
  char (*in_stack_00000130) [86];
  char (*in_stack_00000138) [37];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffffbc;
  Buffer *in_stack_ffffffffffffffc0;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                 (in_stack_ffffffffffffff88,(key_type *)0x26d6c9);
  local_20._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 (in_stack_ffffffffffffff88);
  bVar1 = std::operator!=(local_18,&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)0x26d7bb);
    getHeader<lrit::PrimaryHeader>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  util::str<char[37],char[86],char[2],int>
            (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
  std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffffc0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

H getHeader(const Buffer& b, const HeaderMap& m) {
  auto it = m.find(H::CODE);
  ASSERT(it != m.end());
  return getHeader<H>(b, it->second);
}